

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddRectFilled
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float rounding,int rounding_corners_flags)

{
  if (0xffffff < col) {
    if (rounding <= 0.0) {
      PrimReserve(this,6,4);
      PrimRect(this,a,b,col);
      return;
    }
    PathRect(this,a,b,rounding,rounding_corners_flags);
    AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilled(const ImVec2& a, const ImVec2& b, ImU32 col, float rounding, int rounding_corners_flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (rounding > 0.0f)
    {
        PathRect(a, b, rounding, rounding_corners_flags);
        PathFillConvex(col);
    }
    else
    {
        PrimReserve(6, 4);
        PrimRect(a, b, col);
    }
}